

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_array_suite.cpp
# Opt level: O2

void api_suite::api_ctor_move_assign(void)

{
  size_type local_60;
  undefined4 local_54;
  circular_array<int,_4UL> data;
  
  data.super_circular_view<int,_4UL>.member.data = (pointer)&data;
  data.super_circular_view<int,_4UL>.member.size = 0;
  data.super_circular_view<int,_4UL>.member.next = 4;
  vista::circular_view<int,_4UL>::push_back(&data.super_circular_view<int,_4UL>,0xb);
  local_60 = data.super_circular_view<int,_4UL>.member.size;
  local_54 = 1;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("copy.size()","1",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_suite.cpp"
             ,0x40,"void api_suite::api_ctor_move_assign()",&local_60,&local_54);
  local_60 = 4;
  local_54 = 4;
  boost::detail::test_with_impl<boost::detail::lw_test_eq,unsigned_long,int>
            ("copy.capacity()","4",
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_array_suite.cpp"
             ,0x41,"void api_suite::api_ctor_move_assign()",&local_60,&local_54);
  return;
}

Assistant:

void api_ctor_move_assign()
{
    circular_array<int, 4> data;
    data.push_back(11);
    circular_array<int, 4> copy;
    copy = std::move(data);
    BOOST_TEST_EQ(copy.size(), 1);
    BOOST_TEST_EQ(copy.capacity(), 4);
}